

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer.cpp
# Opt level: O0

void Fossilize::ExternalReplayer::compute_condensed_progress
               (Progress *progress,uint *completed,uint *total)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint total_weighted_skipped;
  uint compiled_raytracing;
  uint compiled_compute;
  uint compiled_graphics;
  uint weighted_decompressed_modules;
  uint local_50;
  uint decompressed_modules;
  uint weighted_skipped_raytracing;
  uint total_work_raytracing;
  uint skipped_raytracing;
  uint weighted_skipped_compute;
  uint total_work_compute;
  uint skipped_compute;
  uint weighted_skipped_graphics;
  uint total_work_graphics;
  uint skipped_graphics;
  uint SkipWeightDivider;
  uint weighted_total_modules;
  uint ModuleWeightDivider;
  uint *total_local;
  uint *completed_local;
  Progress *progress_local;
  
  SkipWeightDivider = 10;
  skipped_graphics = (progress->total_modules + 9) / 10;
  total_work_graphics = 100;
  weighted_skipped_graphics = (progress->graphics).cached + (progress->graphics).skipped;
  uVar1 = progress->total_graphics_pipeline_blobs;
  _weighted_total_modules = total;
  total_local = completed;
  completed_local = (uint *)progress;
  puVar6 = std::min<unsigned_int>
                     (&progress->total_graphics_pipeline_blobs,&weighted_skipped_graphics);
  skipped_compute = uVar1 - *puVar6;
  total_work_compute = (weighted_skipped_graphics + 99) / 100;
  weighted_skipped_compute = completed_local[4] + completed_local[3];
  uVar2 = completed_local[0x1a];
  puVar6 = std::min<unsigned_int>(completed_local + 0x1a,&weighted_skipped_compute);
  skipped_raytracing = uVar2 - *puVar6;
  total_work_raytracing = (weighted_skipped_compute + 99) / 100;
  weighted_skipped_raytracing = completed_local[0x10] + completed_local[0xf];
  uVar2 = completed_local[0x1b];
  puVar6 = std::min<unsigned_int>(completed_local + 0x1b,&weighted_skipped_raytracing);
  decompressed_modules = uVar2 - *puVar6;
  local_50 = (weighted_skipped_raytracing + 99) / 100;
  compiled_graphics =
       completed_local[0x12] + completed_local[0x16] + completed_local[0x15] + completed_local[0x13]
  ;
  puVar6 = std::min<unsigned_int>(&compiled_graphics,completed_local + 0x14);
  weighted_decompressed_modules = *puVar6;
  uVar4 = weighted_decompressed_modules + 9;
  puVar6 = std::min<unsigned_int>(completed_local + 8,&skipped_compute);
  uVar2 = *puVar6;
  puVar6 = std::min<unsigned_int>(completed_local + 2,&skipped_raytracing);
  uVar3 = *puVar6;
  puVar6 = std::min<unsigned_int>(completed_local + 0xe,&decompressed_modules);
  *total_local = uVar2 + uVar3 + *puVar6 + uVar4 / 10;
  *_weighted_total_modules =
       skipped_compute + skipped_raytracing + decompressed_modules + skipped_graphics;
  iVar5 = total_work_compute + total_work_raytracing + local_50;
  *total_local = iVar5 + *total_local;
  *_weighted_total_modules = iVar5 + *_weighted_total_modules;
  return;
}

Assistant:

void ExternalReplayer::compute_condensed_progress(const Progress &progress, unsigned &completed, unsigned &total)
{
	// Some pipelines might be compiled twice if they are derivable pipelines especially when using multi-process replays.
	// There are also shenanigans when pipelines are compiled multiple times as a result of crash recoveries.
	// We do not know ahead of time how many modules we are going to compile from the archive.
	// This depends entirely on which modules the pipelines refer to.
	// Due to all these quirks, it is somewhat complicated to provide an accurate metric on completion.

	// As modules are pulled in, they increase the total progress.
	// Since it may look like progress is moving backwards in this scenario,
	// it's better to heavily discount shader module progress.
	constexpr unsigned ModuleWeightDivider = 10;
	unsigned weighted_total_modules = (progress.total_modules + ModuleWeightDivider - 1) / ModuleWeightDivider;

	// Skipped pipelines (i.e. we only did parsing) mostly lower the total,
	// but to get some semblance of forward progress in the total,
	// increment the progress by 1 for every 100 skipped pipelines.
	// This is mostly relevant for cached pipeline replays.
	constexpr unsigned SkipWeightDivider = 100;

	// If we have crashes or other unexpected behavior, these values might increase beyond the expected value.
	// Just clamp it to never report obviously wrong values.
	// The only glitch we risk is that we're stuck at "100%" a bit longer,
	// but UI can always report something here when we know we're not done yet.

	// To aim for good forward progress metrics, skipped or cached pipelines where we're not doing anything useful should subtract from the total instead.
	unsigned skipped_graphics = progress.graphics.cached + progress.graphics.skipped;
	unsigned total_work_graphics = progress.total_graphics_pipeline_blobs -
	                               (std::min)(progress.total_graphics_pipeline_blobs, skipped_graphics);
	unsigned weighted_skipped_graphics = (skipped_graphics + SkipWeightDivider - 1) / SkipWeightDivider;

	unsigned skipped_compute = progress.compute.cached + progress.compute.skipped;
	unsigned total_work_compute = progress.total_compute_pipeline_blobs -
	                              (std::min)(progress.total_compute_pipeline_blobs, skipped_compute);
	unsigned weighted_skipped_compute = (skipped_compute + SkipWeightDivider - 1) / SkipWeightDivider;

	unsigned skipped_raytracing = progress.raytracing.cached + progress.raytracing.skipped;
	unsigned total_work_raytracing = progress.total_raytracing_pipeline_blobs -
	                                 (std::min)(progress.total_raytracing_pipeline_blobs, skipped_raytracing);
	unsigned weighted_skipped_raytracing = (skipped_raytracing + SkipWeightDivider - 1) / SkipWeightDivider;

	unsigned decompressed_modules = (std::min)(progress.completed_modules + progress.module_validation_failures +
	                                           progress.banned_modules + progress.missing_modules, progress.total_modules);
	unsigned weighted_decompressed_modules = (decompressed_modules + ModuleWeightDivider - 1) / ModuleWeightDivider;

	unsigned compiled_graphics = (std::min)(progress.graphics.completed, total_work_graphics);
	unsigned compiled_compute = (std::min)(progress.compute.completed, total_work_compute);
	unsigned compiled_raytracing = (std::min)(progress.raytracing.completed, total_work_raytracing);

	completed = compiled_graphics + compiled_compute + compiled_raytracing + weighted_decompressed_modules;
	total = total_work_graphics + total_work_compute + total_work_raytracing + weighted_total_modules;

	unsigned total_weighted_skipped = weighted_skipped_graphics + weighted_skipped_compute + weighted_skipped_raytracing;
	completed += total_weighted_skipped;
	total += total_weighted_skipped;
}